

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

LinkedSection * smalldata_section(GlobalVars *gv)

{
  LinkedSection *pLVar1;
  LinkedSection *local_38;
  LinkedSection *nextls;
  LinkedSection *firstls;
  LinkedSection *ldls;
  LinkedSection *ls;
  GlobalVars *gv_local;
  
  ldls = (LinkedSection *)0x0;
  firstls = (LinkedSection *)0x0;
  pLVar1 = (LinkedSection *)(gv->lnksec).first;
  do {
    do {
      ls = pLVar1;
      pLVar1 = (LinkedSection *)(ls->n).next;
      if (pLVar1 == (LinkedSection *)0x0) {
        if (ldls == (LinkedSection *)0x0) {
          local_38 = firstls;
        }
        else {
          local_38 = ldls;
        }
        return local_38;
      }
    } while (((ls->flags & 1) == 0) || (ls->size == 0));
    if (firstls == (LinkedSection *)0x0) {
      firstls = ls;
    }
    if ((ls->type == '\x02') || ((ls->type == '\x03' && (ldls == (LinkedSection *)0x0)))) {
      ldls = ls;
    }
  } while ((ls->flags & 4) == 0);
  return ls;
}

Assistant:

struct LinkedSection *smalldata_section(struct GlobalVars *gv)
/* Return pointer to first small data LinkedSection. If not existing, */
/* return first data/bss section or the first section. */
{
  struct LinkedSection *ls = (struct LinkedSection *)gv->lnksec.first;
  struct LinkedSection *ldls=NULL,*firstls=NULL,*nextls;

  while (nextls = (struct LinkedSection *)ls->n.next) {
    if ((ls->flags & SF_ALLOC) && ls->size!=0) {
      if (firstls == NULL)
        firstls = ls;
      if (ls->type==ST_DATA || ls->type==ST_UDATA && ldls==NULL)
        ldls = ls;
      if (ls->flags & SF_SMALLDATA)  /* first SD section found! */
        return ls;
    }
    ls = nextls;
  }
  return ldls ? ldls : firstls;
}